

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

cmTarget * __thiscall
cmGlobalGenerator::FindTarget(cmGlobalGenerator *this,string *name,bool excludeAliases)

{
  const_iterator cVar1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_true>
  _Var2;
  cmTarget *pcVar3;
  undefined3 in_register_00000011;
  
  if ((CONCAT31(in_register_00000011,excludeAliases) == 0) &&
     (cVar1 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->AliasTargets)._M_h,name),
     cVar1.
     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_true>
     ._M_cur != (__node_type *)0x0)) {
    pcVar3 = *(cmTarget **)
              ((long)cVar1.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_true>
                     ._M_cur + 0x28);
  }
  else {
    _Var2._M_cur = (__node_type *)
                   std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(this->TotalTargets)._M_h,name);
    if ((_Var2._M_cur == (__node_type *)0x0) &&
       (_Var2._M_cur = (__node_type *)
                       std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(&(this->ImportedTargets)._M_h,name),
       _Var2._M_cur == (__node_type *)0x0)) {
      pcVar3 = (cmTarget *)0x0;
    }
    else {
      pcVar3 = *(cmTarget **)
                ((long)&((_Var2._M_cur)->
                        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>
                        ._M_storage._M_storage + 0x20);
    }
  }
  return pcVar3;
}

Assistant:

cmTarget*
cmGlobalGenerator::FindTarget(const std::string& name,
                              bool excludeAliases) const
{
  if (!excludeAliases)
    {
    TargetMap::const_iterator ai = this->AliasTargets.find(name);
    if (ai != this->AliasTargets.end())
      {
      return ai->second;
      }
    }
  TargetMap::const_iterator i = this->TotalTargets.find ( name );
  if ( i != this->TotalTargets.end() )
    {
    return i->second;
    }
  i = this->ImportedTargets.find(name);
  if ( i != this->ImportedTargets.end() )
    {
    return i->second;
    }
  return 0;
}